

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.hpp
# Opt level: O3

TimeRepresentation<count_time<9,_long>_> __thiscall
gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
          (utilities *this,string_view timeString)

{
  baseType bVar1;
  double dVar2;
  string_view timeString_00;
  
  timeString_00._M_str = (char *)timeString._M_len;
  bVar1 = 0x7fffffffffffffff;
  timeString_00._M_len = (size_t)this;
  dVar2 = getTimeValue(timeString_00,sec);
  if (dVar2 <= -9223372036.854765) {
    bVar1 = -0x7fffffffffffffff;
  }
  else if (dVar2 < 9223372036.854765) {
    bVar1 = (baseType)
            (dVar2 * 1000000000.0 +
            *(double *)(&DAT_0041eab0 + (ulong)(0.0 <= dVar2 * 1000000000.0) * 8));
  }
  return (TimeRepresentation<count_time<9,_long>_>)bVar1;
}

Assistant:

timeX loadTimeFromString(std::string_view timeString)
{
    return timeX(getTimeValue(timeString));
}